

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

void __thiscall
IR::GeneratorBailInInstr::GeneratorBailInInstr
          (GeneratorBailInInstr *this,JitArenaAllocator *allocator,Instr *yieldInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  LabelInstr::LabelInstr(&this->super_LabelInstr,allocator);
  (this->super_LabelInstr).super_Instr._vptr_Instr = (_func_int **)&PTR_Dump_014ea928;
  this->yieldInstr = yieldInstr;
  (this->capturedValues).constantValues.super_RealCount.count = 0;
  (this->capturedValues).constantValues.super_SListNodeBase<Memory::ArenaAllocator>.next =
       (Type)&this->capturedValues;
  (this->capturedValues).copyPropSyms.super_RealCount.count = 0;
  (this->capturedValues).copyPropSyms.super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->capturedValues).copyPropSyms.super_SListNodeBase<Memory::ArenaAllocator>;
  (this->capturedValues).argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->capturedValues).refCount = 0;
  (this->upwardExposedUses).head = (Type_conflict)0x0;
  (this->upwardExposedUses).lastFoundIndex = (Type_conflict)0x0;
  (this->upwardExposedUses).alloc = allocator;
  (this->upwardExposedUses).lastUsedNodePrevNextField = &(this->upwardExposedUses).head;
  if ((yieldInstr == (Instr *)0x0) || (yieldInstr->m_opcode != Yield)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x465,"(yieldInstr != nullptr && yieldInstr->m_opcode == Js::OpCode::Yield)"
                       ,"yieldInstr != nullptr && yieldInstr->m_opcode == Js::OpCode::Yield");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

GeneratorBailInInstr(JitArenaAllocator* allocator, IR::Instr* yieldInstr) :
        LabelInstr(allocator),
        yieldInstr(yieldInstr),
        upwardExposedUses(allocator)
    {
        Assert(yieldInstr != nullptr && yieldInstr->m_opcode == Js::OpCode::Yield);
    }